

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_GetTemplate::Run(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Template *pTVar4;
  allocator local_51;
  undefined1 local_50 [32];
  string filename;
  
  std::__cxx11::string::string((string *)local_50,"{This is perfectly valid} yay!",&local_51);
  ctemplate::StringToTemplateFile(&filename,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  local_50._0_8_ = filename._M_dataplus._M_p;
  local_50._8_8_ = filename._M_string_length;
  local_50[0x10] = '\0';
  local_50._24_8_ = 0;
  lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_50,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString((TemplateString *)local_50,filename._M_dataplus._M_p);
  lVar2 = ctemplate::Template::GetTemplate((TemplateString *)local_50,DO_NOT_STRIP);
  local_50._0_8_ = filename._M_dataplus._M_p;
  local_50._8_8_ = filename._M_string_length;
  local_50[0x10] = '\0';
  local_50._24_8_ = 0;
  lVar3 = ctemplate::Template::GetTemplate((TemplateString *)local_50,STRIP_WHITESPACE);
  if (((lVar1 == 0) || (lVar2 == 0)) || (lVar3 == 0)) {
    printf("ASSERT FAILED, line %d: %s\n",0x45c,"tpl1 && tpl2 && tpl3");
    __assert_fail("tpl1 && tpl2 && tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x45c,"static void Test_Template_GetTemplate::Run()");
  }
  if (lVar1 != lVar2) {
    printf("ASSERT FAILED, line %d: %s\n",0x45d,"tpl1 == tpl2");
    __assert_fail("tpl1 == tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x45d,"static void Test_Template_GetTemplate::Run()");
  }
  if (lVar1 == lVar3) {
    printf("ASSERT FAILED, line %d: %s\n",0x45e,"tpl1 != tpl3");
    __assert_fail("tpl1 != tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x45e,"static void Test_Template_GetTemplate::Run()");
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)local_50,"/yakakak");
  lVar1 = ctemplate::Template::GetTemplate((TemplateString *)local_50,STRIP_WHITESPACE);
  if (lVar1 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x462,"!tpl4");
    __assert_fail("!tpl4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x462,"static void Test_Template_GetTemplate::Run()");
  }
  std::__cxx11::string::string((string *)local_50,"{{This has spaces in it}}",&local_51);
  pTVar4 = ctemplate::StringToTemplate((string *)local_50,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)local_50);
  if (pTVar4 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x466,"!tpl5");
    __assert_fail("!tpl5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x466,"static void Test_Template_GetTemplate::Run()");
  }
  std::__cxx11::string::string((string *)local_50,"{{#SEC}}foo",&local_51);
  pTVar4 = ctemplate::StringToTemplate((string *)local_50,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)local_50);
  if (pTVar4 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x468,"!tpl6");
    __assert_fail("!tpl6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x468,"static void Test_Template_GetTemplate::Run()");
  }
  std::__cxx11::string::string((string *)local_50,"{{#S1}}foo{{/S2}}",&local_51);
  pTVar4 = ctemplate::StringToTemplate((string *)local_50,DO_NOT_STRIP);
  std::__cxx11::string::~string((string *)local_50);
  if (pTVar4 == (Template *)0x0) {
    std::__cxx11::string::string((string *)local_50,"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}",&local_51);
    pTVar4 = ctemplate::StringToTemplate((string *)local_50,DO_NOT_STRIP);
    std::__cxx11::string::~string((string *)local_50);
    if (pTVar4 != (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x46d,"!tpl8");
      __assert_fail("!tpl8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x46d,"static void Test_Template_GetTemplate::Run()");
    }
    std::__cxx11::string::string((string *)local_50,"{{noend",&local_51);
    pTVar4 = ctemplate::StringToTemplate((string *)local_50,DO_NOT_STRIP);
    std::__cxx11::string::~string((string *)local_50);
    if (pTVar4 == (Template *)0x0) {
      std::__cxx11::string::~string((string *)&filename);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x46f,"!tpl9");
    __assert_fail("!tpl9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x46f,"static void Test_Template_GetTemplate::Run()");
  }
  printf("ASSERT FAILED, line %d: %s\n",0x46a,"!tpl7");
  __assert_fail("!tpl7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x46a,"static void Test_Template_GetTemplate::Run()");
}

Assistant:

TEST(Template, GetTemplate) {
  // Tests the cache
  string filename = StringToTemplateFile("{This is perfectly valid} yay!");
  Template* tpl1 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template* tpl2 = Template::GetTemplate(filename.c_str(), DO_NOT_STRIP);
  Template* tpl3 = Template::GetTemplate(filename, STRIP_WHITESPACE);
  ASSERT(tpl1 && tpl2 && tpl3);
  ASSERT(tpl1 == tpl2);
  ASSERT(tpl1 != tpl3);

  // Tests that a nonexistent template returns NULL
  Template* tpl4 = Template::GetTemplate("/yakakak", STRIP_WHITESPACE);
  ASSERT(!tpl4);

  // Tests that syntax errors cause us to return NULL
  Template* tpl5 = StringToTemplate("{{This has spaces in it}}", DO_NOT_STRIP);
  ASSERT(!tpl5);
  Template* tpl6 = StringToTemplate("{{#SEC}}foo", DO_NOT_STRIP);
  ASSERT(!tpl6);
  Template* tpl7 = StringToTemplate("{{#S1}}foo{{/S2}}", DO_NOT_STRIP);
  ASSERT(!tpl7);
  Template* tpl8 = StringToTemplate("{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}",
                                    DO_NOT_STRIP);
  ASSERT(!tpl8);
  Template* tpl9 = StringToTemplate("{{noend", DO_NOT_STRIP);
  ASSERT(!tpl9);
}